

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O3

Orphan<capnproto_test::capnp::test::TestInterface> * __thiscall
capnp::Orphan<capnp::DynamicValue>::releaseAs<capnproto_test::capnp::test::TestInterface>
          (Orphan<capnproto_test::capnp::test::TestInterface> *__return_storage_ptr__,
          Orphan<capnp::DynamicValue> *this)

{
  CapTableBuilder *pCVar1;
  long *plVar2;
  undefined1 local_70 [16];
  long *local_60;
  Builder local_58;
  
  get(&local_58,this);
  DynamicValue::Builder::AsImpl<capnproto_test::capnp::test::TestInterface,_(capnp::Kind)5>::apply
            ((Client *)local_70,&local_58);
  plVar2 = local_60;
  if (local_60 != (long *)0x0) {
    local_60 = (long *)0x0;
    (*(code *)**(undefined8 **)local_70._8_8_)
              (local_70._8_8_,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  DynamicValue::Builder::~Builder(&local_58);
  this->type = UNKNOWN;
  pCVar1 = (this->builder).capTable;
  (__return_storage_ptr__->builder).segment = (this->builder).segment;
  (__return_storage_ptr__->builder).capTable = pCVar1;
  (__return_storage_ptr__->builder).location = (this->builder).location;
  (__return_storage_ptr__->builder).tag.content = (this->builder).tag.content;
  (this->builder).segment = (SegmentBuilder *)0x0;
  (this->builder).location = (word *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Orphan<T> Orphan<DynamicValue>::releaseAs() {
  get().as<T>();  // type check
  type = DynamicValue::UNKNOWN;
  return Orphan<T>(kj::mv(builder));
}